

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset.cpp
# Opt level: O0

void trimesh::
     assign_pairs2<1,boost::iterators::counting_iterator<int,boost::use_default,boost::use_default>>
               (dataset_t *ds,counting_iterator<int,_boost::use_default,_boost::use_default> *b,
               counting_iterator<int,_boost::use_default,_boost::use_default> *e)

{
  bind_t<bool,_boost::_mfi::cmf2<bool,_trimesh::dataset_t,_const_int_&,_const_int_&>,_boost::_bi::list3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>_>
  __comp;
  type_conflict1 tVar1;
  bool bVar2;
  bool bVar3;
  reference piVar4;
  ostream *poVar5;
  runtime_error *this;
  storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_> sVar6;
  ulong uVar7;
  cellid_t *mcf;
  string local_270 [48];
  stringstream local_240 [8];
  stringstream ss;
  ostream local_230 [376];
  uint local_b8;
  int local_b4;
  uint pos;
  int np;
  undefined8 local_a8;
  F local_98;
  remove_cv_ref_t<decltype(bind(&dataset_t::compare_cells<1___1>,_&ds,__1,__2))> cmp;
  cellid_t *cfe;
  cellid_t cf [20];
  int size;
  counting_iterator<int,_boost::use_default,_boost::use_default> *e_local;
  counting_iterator<int,_boost::use_default,_boost::use_default> *b_local;
  dataset_t *ds_local;
  
  cf[0x13] = 0x14;
  _pos = dataset_t::compare_cells<2>;
  local_a8 = 0;
  boost::
  bind<bool,trimesh::dataset_t,int_const&,int_const&,trimesh::dataset_t*,boost::arg<1>,boost::arg<2>>
            (&local_98,(boost *)dataset_t::compare_cells<2>,0,ds);
  local_b4 = 0;
  do {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long>
                        *)b,(iterator_facade<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long>
                             *)e);
    if (!tVar1) {
      return;
    }
    piVar4 = boost::iterators::detail::
             iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
             ::operator*((iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
                          *)b);
    bVar2 = dataset_t::is_paired(ds,*piVar4);
    if (!bVar2) {
      piVar4 = boost::iterators::detail::
               iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
               ::operator*((iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
                            *)b);
      local_b8 = dataset_t::get_cets<(trimesh::eGDIR)1>(ds,*piVar4,(cellid_t *)&cfe);
      if (0x13 < local_b8) {
        std::__cxx11::stringstream::stringstream(local_240);
        poVar5 = std::operator<<(local_230,"Failed to ensure condition ");
        poVar5 = std::operator<<(poVar5,"pos < size");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"at (");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset.cpp"
                                );
        poVar5 = std::operator<<(poVar5,",");
        poVar5 = std::operator<<(poVar5,"assign_pairs2");
        poVar5 = std::operator<<(poVar5,",");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6e);
        poVar5 = std::operator<<(poVar5,") \n ");
        std::operator<<(poVar5,"A maximum of 20 cofacets are assumed. Adjust const above!!");
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(this,local_270);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar7 = (ulong)local_b8;
      cmp.l_.super_storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>.
      super_storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>.
      super_storage1<boost::_bi::value<trimesh::dataset_t_*>_>.a1_.t_ =
           (storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>)
           (storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>)
           (cf + (uVar7 - 2));
      piVar4 = boost::iterators::detail::
               iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
               ::operator*((iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
                            *)b);
      cmp.l_.super_storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>.
      super_storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>.
      super_storage1<boost::_bi::value<trimesh::dataset_t_*>_>.a1_.t_ =
           (storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>)
           filter_elst2((cellid_t *)&cfe,cf + (uVar7 - 2),(cellid_t *)&cfe,*piVar4,ds);
      __comp.f_._8_8_ = cmp.f_.f_;
      __comp.f_.f_ = local_98;
      __comp.l_.
      super_storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>.
      super_storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>.
      super_storage1<boost::_bi::value<trimesh::dataset_t_*>_>.a1_.t_ =
           (storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>)
           (storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>)
           cmp.f_._8_8_;
      sVar6.super_storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>.
      super_storage1<boost::_bi::value<trimesh::dataset_t_*>_>.a1_.t_ =
           (storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>)
           std::
           min_element<int*,boost::_bi::bind_t<bool,boost::_mfi::cmf2<bool,trimesh::dataset_t,int_const&,int_const&>,boost::_bi::list3<boost::_bi::value<trimesh::dataset_t*>,boost::arg<1>,boost::arg<2>>>>
                     ((int *)&cfe,
                      (int *)cmp.l_.
                             super_storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>
                             .
                             super_storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>
                             .super_storage1<boost::_bi::value<trimesh::dataset_t_*>_>.a1_.t_,__comp
                     );
      if (sVar6.super_storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>.
          super_storage1<boost::_bi::value<trimesh::dataset_t_*>_>.a1_.t_ !=
          (storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>)
          cmp.l_.
          super_storage3<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>,_boost::arg<2>_>.
          super_storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>.
          super_storage1<boost::_bi::value<trimesh::dataset_t_*>_>.a1_.t_) {
        bVar2 = dataset_t::is_boundry
                          (ds,*(cellid_t *)
                               sVar6.
                               super_storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>
                               .super_storage1<boost::_bi::value<trimesh::dataset_t_*>_>.a1_.t_);
        piVar4 = boost::iterators::detail::
                 iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
                 ::operator*((iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
                              *)b);
        bVar3 = dataset_t::is_boundry(ds,*piVar4);
        if (bVar2 == bVar3) {
          piVar4 = boost::iterators::detail::
                   iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
                   ::operator*((iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
                                *)b);
          dataset_t::pair(ds,*piVar4,
                          *(cellid_t *)
                           sVar6.
                           super_storage2<boost::_bi::value<trimesh::dataset_t_*>,_boost::arg<1>_>.
                           super_storage1<boost::_bi::value<trimesh::dataset_t_*>_>.a1_.t_);
          local_b4 = local_b4 + 1;
        }
      }
    }
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_const_int_&,_long,_false,_false>
                  *)b);
  } while( true );
}

Assistant:

inline void assign_pairs2(dataset_t &ds,Titer b,Titer e)
  {
	const int size = 20;
	cellid_t cf[size],*cfe;

    BOOST_AUTO(cmp,bind(&dataset_t::compare_cells<dim+1>,&ds,_1,_2));

    int np = 0;

    for(;b!=e;++b)
      if(!ds.is_paired(*b))
      {
		uint pos = ds.get_cets<ASC>(*b, cf);
		ENSURES(pos < size)
				  <<"A maximum of 20 cofacets are assumed. Adjust const above!!";
		cfe = cf + pos;
		cfe = filter_elst2(cf,cfe,cf,*b,ds);

        cellid_t *mcf = min_element(cf,cfe,cmp);

        if( mcf != cfe && ds.is_boundry(*mcf) == ds.is_boundry(*b))
        {
          ds.pair(*b,*mcf); np++;
        }
      }
  }